

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O0

int __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_>::ClassId
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string *in_stack_fffffffffffffc30;
  allocator<char> *in_stack_fffffffffffffc40;
  char *in_stack_fffffffffffffc48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  TPZGeoBlend<pzgeom::TPZGeoLinear> *in_stack_fffffffffffffc60;
  TPZGeoBlend<pzgeom::TPZGeoLinear> *in_stack_fffffffffffffca0;
  allocator<char> local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  uVar1 = Hash(in_stack_fffffffffffffc30);
  iVar2 = TPZGeoEl::ClassId((TPZGeoEl *)0x167ef76);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::TPZGeoBlend(in_stack_fffffffffffffca0);
  iVar3 = pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::ClassId(in_stack_fffffffffffffc60);
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::~TPZGeoBlend
            ((TPZGeoBlend<pzgeom::TPZGeoLinear> *)0x167efc3);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator(&local_29);
  return uVar1 ^ iVar2 * 2 ^ iVar3 << 2;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}